

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_get_encoded_map_size
              (AMQP_MAP_KEY_VALUE_PAIR *pairs,uint32_t count,uint32_t *encoded_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  AMQP_VALUE *ppAVar6;
  size_t item_size;
  
  if (encoded_size == (uint32_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0xf83;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_map_size",0xf82,1,"Bad arguments: encoded_size = %p",0);
    }
  }
  else {
    *encoded_size = 0;
    ppAVar6 = &pairs->value;
    iVar3 = 0;
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = amqpvalue_get_encoded_size
                        (((AMQP_MAP_KEY_VALUE_PAIR *)(ppAVar6 + -1))->key,&item_size);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xfae;
        }
        pcVar4 = "Could not get encoded size for key element %u of the map";
        iVar3 = 0xf8f;
LAB_00149b5d:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_get_encoded_map_size",iVar3,1,pcVar4);
        return 0xfae;
      }
      if ((item_size >> 0x20 != 0) || (CARRY4((uint)item_size,*encoded_size))) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xfae;
        }
        pcVar4 = "Encoded data is more than the max size for a map";
        iVar3 = 0xf96;
        goto LAB_00149b5d;
      }
      *encoded_size = (uint)item_size + *encoded_size;
      iVar1 = amqpvalue_get_encoded_size(*ppAVar6,&item_size);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xfae;
        }
        pcVar4 = "Could not get encoded size for value element %u of the map";
        iVar3 = 0xf9e;
        goto LAB_00149b5d;
      }
      if ((item_size >> 0x20 != 0) || (CARRY4((uint)item_size,*encoded_size))) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xfae;
        }
        pcVar4 = "Encoded data is more than the max size for a map";
        iVar3 = 0xfa5;
        goto LAB_00149b5d;
      }
      *encoded_size = (uint)item_size + *encoded_size;
      ppAVar6 = ppAVar6 + 2;
    }
  }
  return iVar3;
}

Assistant:

static int amqpvalue_get_encoded_map_size(AMQP_MAP_KEY_VALUE_PAIR* pairs, uint32_t count, uint32_t* encoded_size)
{
    size_t i;
    int result;

    if (encoded_size == NULL)
    {
        LogError("Bad arguments: encoded_size = %p", encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;

        /* Get the size of all items in the map */
        for (i = 0; i < count; i++)
        {
            size_t item_size;
            if (amqpvalue_get_encoded_size(pairs[i].key, &item_size) != 0)
            {
                LogError("Could not get encoded size for key element %u of the map", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Encoded data is more than the max size for a map");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);

            if (amqpvalue_get_encoded_size(pairs[i].value, &item_size) != 0)
            {
                LogError("Could not get encoded size for value element %u of the map", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Encoded data is more than the max size for a map");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);
        }

        if (i < count)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}